

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

lu_mem propagatemark(global_State *g)

{
  byte bVar1;
  short sVar2;
  ushort uVar3;
  ushort uVar4;
  lua_State *L;
  CallInfo *pCVar5;
  lua_CFunction p_Var6;
  bool bVar7;
  lua_Alloc *pp_Var8;
  uint uVar9;
  GCObject **ppGVar10;
  TValue *pTVar11;
  lu_mem lVar12;
  char *pcVar13;
  char *pcVar14;
  StkId pSVar15;
  int iVar16;
  GCObject *pGVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  global_State *pgVar21;
  long lVar22;
  StkIdRel *pSVar23;
  UpVal *o;
  global_State *pgVar24;
  bool bVar25;
  
  L = (lua_State *)g->gray;
  bVar1 = L->marked;
  L->marked = bVar1 | 0x20;
  ppGVar10 = getgclist((GCObject *)L);
  g->gray = *ppGVar10;
  lVar12 = 0;
  switch(L->tt) {
  case '\x05':
    pSVar15 = (L->stack_last).p;
    if ((pSVar15 == (StkId)0x0) || (((pSVar15->tbclist).delta & 8) != 0)) {
      pTVar11 = (TValue *)0x0;
    }
    else {
      pTVar11 = luaT_gettm((Table *)&pSVar15->val,TM_MODE,g->tmname[3]);
    }
    pSVar15 = (L->stack_last).p;
    if ((pSVar15 != (StkId)0x0) &&
       ((undefined1  [16])((undefined1  [16])*pSVar15 & (undefined1  [16])0x1800) !=
        (undefined1  [16])0x0)) {
      reallymarkobject(g,(GCObject *)&pSVar15->val);
    }
    if ((pTVar11 == (TValue *)0x0) || (pTVar11->tt_ != 'D')) {
LAB_00114c4b:
      bVar1 = L->allowhook;
      pgVar24 = L->l_G;
      uVar9 = luaH_realasize((Table *)L);
      if (uVar9 != 0) {
        lVar19 = 0;
        do {
          if (((*(byte *)((long)(L->top).p + lVar19 + 8) & 0x40) != 0) &&
             (pGVar17 = *(GCObject **)((long)(L->top).p + lVar19), (pGVar17->marked & 0x18) != 0)) {
            reallymarkobject(g,pGVar17);
          }
          lVar19 = lVar19 + 0x10;
        } while ((ulong)uVar9 << 4 != lVar19);
      }
      for (pgVar21 = L->l_G;
          pgVar21 < (global_State *)(&pgVar24->frealloc + (long)(1 << (bVar1 & 0x1f)) * 3);
          pgVar21 = (global_State *)&pgVar21->GCdebt) {
        if (((ulong)pgVar21->ud & 0xf) == 0) {
          if (((ulong)pgVar21->ud & 0x4000) != 0) {
            *(undefined1 *)((long)&pgVar21->ud + 1) = 0xb;
          }
        }
        else {
          if ((((ulong)pgVar21->ud & 0x4000) != 0) &&
             ((((GCObject *)pgVar21->totalbytes)->marked & 0x18) != 0)) {
            reallymarkobject(g,(GCObject *)pgVar21->totalbytes);
          }
          if ((((ulong)pgVar21->ud & 0x40) != 0) &&
             ((((GCObject *)pgVar21->frealloc)->marked & 0x18) != 0)) {
            reallymarkobject(g,(GCObject *)pgVar21->frealloc);
          }
        }
      }
      genlink(g,(GCObject *)L);
    }
    else {
      p_Var6 = (pTVar11->value_).f;
      pcVar13 = strchr((char *)(p_Var6 + 0x18),0x6b);
      pcVar14 = strchr((char *)(p_Var6 + 0x18),0x76);
      if (pcVar13 == (char *)0x0 && pcVar14 == (char *)0x0) goto LAB_00114c4b;
      if (pcVar13 == (char *)0x0) {
        bVar1 = L->allowhook;
        bVar25 = *(int *)&L->nci != 0;
        if (bVar1 != 0x1f) {
          pgVar24 = L->l_G;
          pp_Var8 = &pgVar24->frealloc;
          bVar25 = *(int *)&L->nci != 0;
          do {
            if (((ulong)pgVar24->ud & 0xf) == 0) {
              if (((ulong)pgVar24->ud & 0x4000) != 0) {
                *(undefined1 *)((long)&pgVar24->ud + 1) = 0xb;
              }
            }
            else {
              if ((((ulong)pgVar24->ud & 0x4000) != 0) &&
                 ((((GCObject *)pgVar24->totalbytes)->marked & 0x18) != 0)) {
                reallymarkobject(g,(GCObject *)pgVar24->totalbytes);
              }
              bVar7 = !bVar25;
              bVar25 = true;
              if (bVar7) {
                if (((ulong)pgVar24->ud & 0x40) == 0) {
                  pGVar17 = (GCObject *)0x0;
                }
                else {
                  pGVar17 = (GCObject *)pgVar24->frealloc;
                }
                iVar16 = iscleared(g,pGVar17);
                bVar25 = iVar16 != 0;
              }
            }
            pgVar24 = (global_State *)&pgVar24->GCdebt;
          } while (pgVar24 < pp_Var8 + (long)(1 << (bVar1 & 0x1f)) * 3);
        }
        if ((g->gcstate == '\x02') && (bVar25)) {
          L->stack = (StkIdRel)g->weak;
          g->weak = (GCObject *)L;
        }
        else {
          L->stack = (StkIdRel)g->grayagain;
          g->grayagain = (GCObject *)L;
        }
LAB_00114ed2:
        L->marked = L->marked & 199;
      }
      else {
        if (pcVar14 != (char *)0x0) {
          L->stack = (StkIdRel)g->allweak;
          g->allweak = (GCObject *)L;
          goto LAB_00114ed2;
        }
        traverseephemeron(g,(Table *)L,0);
      }
    }
    if (L->ci == (CallInfo *)0x0) {
      iVar16 = 0;
    }
    else {
      iVar16 = 2 << (L->allowhook & 0x1f);
    }
    lVar12 = (lu_mem)(*(int *)&L->nci + iVar16 + 1);
    break;
  case '\x06':
    pgVar24 = L->l_G;
    if ((pgVar24 != (global_State *)0x0) && (((ulong)pgVar24->ud & 0x1800) != 0)) {
      reallymarkobject(g,(GCObject *)pgVar24);
    }
    uVar20 = (ulong)L->status;
    if (L->status != 0) {
      uVar18 = 0;
      do {
        pCVar5 = (&L->ci)[uVar18];
        if ((pCVar5 != (CallInfo *)0x0) && (((pCVar5->top).offset & 0x1800U) != 0)) {
          reallymarkobject(g,(GCObject *)pCVar5);
        }
        uVar18 = uVar18 + 1;
        uVar20 = (ulong)L->status;
      } while (uVar18 < uVar20);
    }
    goto LAB_00114b9b;
  case '\a':
    pgVar24 = L->l_G;
    if ((pgVar24 != (global_State *)0x0) && (((ulong)pgVar24->ud & 0x1800) != 0)) {
      reallymarkobject(g,(GCObject *)pgVar24);
    }
    sVar2._0_1_ = L->status;
    sVar2._1_1_ = L->allowhook;
    if (sVar2 != 0) {
      pSVar23 = &L->stack;
      uVar20 = 0;
      do {
        if ((((ulong)*pSVar23 & 0x40) != 0) &&
           ((undefined1  [16])((undefined1  [16])*pSVar23[-1].p & (undefined1  [16])0x1800) !=
            (undefined1  [16])0x0)) {
          reallymarkobject(g,(GCObject *)&(pSVar23[-1].p)->val);
        }
        uVar20 = uVar20 + 1;
        uVar3._0_1_ = L->status;
        uVar3._1_1_ = L->allowhook;
        pSVar23 = pSVar23 + 2;
      } while (uVar20 < uVar3);
    }
    genlink(g,(GCObject *)L);
    uVar4._0_1_ = L->status;
    uVar4._1_1_ = L->allowhook;
    uVar20 = (ulong)uVar4;
    goto LAB_00114b9b;
  case '\b':
    pSVar15 = (L->stack).p;
    if (((bVar1 & 6) != 0) || (g->gcstate == '\0')) {
      L->gclist = g->grayagain;
      g->grayagain = (GCObject *)L;
      L->marked = bVar1 & 199;
    }
    if (pSVar15 == (StkId)0x0) {
      lVar12 = 1;
    }
    else {
      for (; pSVar15 < (L->top).p; pSVar15 = pSVar15 + 1) {
        if ((((pSVar15->val).tt_ & 0x40) != 0) && (((*(GCObject **)pSVar15)->marked & 0x18) != 0)) {
          reallymarkobject(g,*(GCObject **)pSVar15);
        }
      }
      for (o = L->openupval; o != (UpVal *)0x0; o = (o->u).open.next) {
        if ((o->marked & 0x18) != 0) {
          reallymarkobject(g,(GCObject *)o);
        }
      }
      if (g->gcstate == '\x02') {
        if (g->gcemergency == '\0') {
          luaD_shrinkstack(L);
        }
        for (pSVar15 = (L->top).p; pSVar15 < (StkId)((L->stack_last).offset + 0x50);
            pSVar15 = pSVar15 + 1) {
          (pSVar15->val).tt_ = '\0';
        }
        if ((L->twups == L) && (L->openupval != (UpVal *)0x0)) {
          L->twups = g->twups;
          g->twups = L;
        }
      }
      lVar12 = ((long)(L->stack_last).p - (L->stack).offset) * 0x10000000 + 0x100000000 >> 0x20;
    }
    break;
  case '\t':
    break;
  case '\n':
    pCVar5 = (L->base_ci).previous;
    if ((pCVar5 != (CallInfo *)0x0) && (((pCVar5->top).offset & 0x1800U) != 0)) {
      reallymarkobject(g,(GCObject *)pCVar5);
    }
    if (0 < *(int *)((long)&L->top + 4)) {
      lVar22 = 8;
      lVar19 = 0;
      do {
        if (((*(byte *)((long)&L->openupval->next + lVar22) & 0x40) != 0) &&
           (pGVar17 = *(GCObject **)((long)L->openupval + lVar22 + -8),
           (pGVar17->marked & 0x18) != 0)) {
          reallymarkobject(g,pGVar17);
        }
        lVar19 = lVar19 + 1;
        lVar22 = lVar22 + 0x10;
      } while (lVar19 < *(int *)((long)&L->top + 4));
    }
    if (0 < *(int *)&L->top) {
      lVar22 = 0;
      lVar19 = 0;
      do {
        pGVar17 = *(GCObject **)((long)&L->twups->next + lVar22);
        if ((pGVar17 != (GCObject *)0x0) && ((pGVar17->marked & 0x18) != 0)) {
          reallymarkobject(g,pGVar17);
        }
        lVar19 = lVar19 + 1;
        lVar22 = lVar22 + 0x10;
      } while (lVar19 < *(int *)&L->top);
    }
    if (0 < *(int *)&L->ci) {
      lVar19 = 0;
      do {
        pGVar17 = (&L->gclist->next)[lVar19];
        if ((pGVar17 != (GCObject *)0x0) && ((pGVar17->marked & 0x18) != 0)) {
          reallymarkobject(g,pGVar17);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < *(int *)&L->ci);
    }
    iVar16 = *(int *)((long)&L->ci + 4);
    if (0 < iVar16) {
      lVar22 = 0;
      lVar19 = 0;
      do {
        pGVar17 = *(GCObject **)((long)(L->base_ci).top.p + lVar22);
        if ((pGVar17 != (GCObject *)0x0) && ((pGVar17->marked & 0x18) != 0)) {
          reallymarkobject(g,pGVar17);
        }
        lVar19 = lVar19 + 1;
        iVar16 = *(int *)((long)&L->ci + 4);
        lVar22 = lVar22 + 0x10;
      } while (lVar19 < iVar16);
    }
    lVar12 = (lu_mem)(iVar16 + *(int *)((long)&L->top + 4) + *(int *)&L->top + *(int *)&L->ci + 1);
    break;
  default:
    if (L->tt != '&') {
      return 0;
    }
    uVar20 = (ulong)L->status;
    if (L->status != 0) {
      pSVar23 = &L->stack_last;
      uVar18 = 0;
      do {
        if ((((ulong)*pSVar23 & 0x40) != 0) &&
           (((((CallInfo *)pSVar23[-1].p)->top).offset & 0x1800U) != 0)) {
          reallymarkobject(g,(GCObject *)pSVar23[-1].p);
        }
        uVar18 = uVar18 + 1;
        uVar20 = (ulong)L->status;
        pSVar23 = pSVar23 + 2;
      } while (uVar18 < uVar20);
    }
LAB_00114b9b:
    lVar12 = uVar20 + 1;
  }
  return lVar12;
}

Assistant:

static lu_mem propagatemark (global_State *g) {
  GCObject *o = g->gray;
  nw2black(o);
  g->gray = *getgclist(o);  /* remove from 'gray' list */
  switch (o->tt) {
    case LUA_VTABLE: return traversetable(g, gco2t(o));
    case LUA_VUSERDATA: return traverseudata(g, gco2u(o));
    case LUA_VLCL: return traverseLclosure(g, gco2lcl(o));
    case LUA_VCCL: return traverseCclosure(g, gco2ccl(o));
    case LUA_VPROTO: return traverseproto(g, gco2p(o));
    case LUA_VTHREAD: return traversethread(g, gco2th(o));
    default: lua_assert(0); return 0;
  }
}